

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  EventLoop *loop_local;
  TimerQueue *this_local;
  
  this->m_loop = loop;
  MinHeap<sznet::Timer>::MinHeap(&this->m_timerMinHeap,event_greater);
  std::
  set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
  ::set(&this->m_activeTimers);
  return;
}

Assistant:

TimerQueue::TimerQueue(net::EventLoop* loop):
	m_loop(loop),
	m_timerMinHeap(event_greater)
{
}